

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPML_ALG_Unmarshal(TPML_ALG *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT32_Unmarshal(&target->count,buffer,size);
  if (TVar1 == 0) {
    TVar1 = 0x95;
    if (target->count < 0x41) {
      TVar1 = TPM_ALG_ID_Array_Unmarshal(target->algorithms,buffer,size,target->count);
      return TVar1;
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPML_ALG_Unmarshal(TPML_ALG *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT32_Unmarshal((UINT32 *)&(target->count), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if((target->count) > MAX_ALG_LIST_SIZE)
        return TPM_RC_SIZE;
    result = TPM_ALG_ID_Array_Unmarshal((TPM_ALG_ID *)(target->algorithms), buffer, size, (INT32)(target->count));
    return result;
}